

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::Extend(ON_NurbsSurface *this,int dir,ON_Interval *domain)

{
  bool bVar1;
  int iVar2;
  ON_NurbsCurve *pOVar3;
  ON_NurbsCurve crv;
  ON_NurbsCurve local_60;
  
  if ((1 < (uint)dir) ||
     (iVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])(),
     (char)iVar2 != '\0')) {
    return false;
  }
  ON_NurbsCurve::ON_NurbsCurve(&local_60);
  pOVar3 = ToCurve(this,dir,&local_60);
  if (pOVar3 != (ON_NurbsCurve *)0x0) {
    bVar1 = ON_NurbsCurve::Extend(&local_60,domain);
    FromCurve(&local_60,this,dir);
    if (bVar1) {
      bVar1 = true;
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      goto LAB_00544d7c;
    }
  }
  bVar1 = false;
LAB_00544d7c:
  ON_NurbsCurve::~ON_NurbsCurve(&local_60);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{

  bool rc = false;
  if ( dir < 0 || dir > 1 )
    return false;
  if (IsClosed(dir)) return false;

  ON_NurbsCurve crv;
  if ( ToCurve(*this,dir,&crv) )
  {
    rc = crv.Extend( domain );
    FromCurve( crv, *this, dir );
  }

  if (rc){
    DestroySurfaceTree();
  }
  return rc;

}